

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O2

void miniwalk(int x,int y)

{
  byte *pbVar1;
  uint uVar2;
  uchar *puVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  int x_00;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int dirs [4];
  
  uVar6 = (ulong)(uint)y;
  do {
    lVar9 = (long)x;
    iVar5 = (int)uVar6;
    if (x < 1) {
      uVar8 = 0;
LAB_00198b1b:
      uVar7 = uVar8;
      if (((*(byte *)((long)iVar5 * 0xc + lVar9 * 0x24 + 0x321d25) & 8) == 0) &&
         ((*(char *)((long)iVar5 * 0xc + (long)(int)(x + 1) * 0x24 + 0x321d25) == '\0' ||
          (uVar2 = mt_random(), uVar2 % 10 == 0)))) {
        uVar7 = (ulong)((int)uVar8 + 1);
        dirs[uVar8] = 1;
      }
    }
    else {
      uVar7 = 0;
      if ((*(byte *)((long)iVar5 * 0xc + (ulong)(uint)x * 0x24 + 0x321d25) & 4) == 0) {
        if (*(char *)((long)iVar5 * 0xc + (ulong)(x - 1) * 0x24 + 0x321d25) != '\0') {
          uVar2 = mt_random();
          uVar7 = 0;
          if (uVar2 % 10 != 0) goto LAB_00198b0e;
        }
        dirs[0] = 0;
        uVar7 = 1;
      }
LAB_00198b0e:
      uVar8 = uVar7;
      if (x == 1) goto LAB_00198b1b;
    }
    uVar8 = uVar7;
    if (iVar5 < 1) {
LAB_00198ba3:
      x_00 = (int)uVar8;
      if (((r[lVar9][iVar5].doortable & 2) != 0) ||
         ((r[lVar9][iVar5 + 1].doortable != '\0' && (uVar2 = mt_random(), uVar2 % 10 != 0))))
      goto LAB_00198bd9;
      x_00 = x_00 + 1;
      dirs[uVar8] = 3;
    }
    else {
      if (((r[lVar9][uVar6].doortable & 1) == 0) &&
         ((r[lVar9][iVar5 - 1].doortable == '\0' || (uVar2 = mt_random(), uVar2 % 10 == 0)))) {
        uVar8 = (ulong)((int)uVar7 + 1);
        dirs[uVar7] = 2;
      }
      x_00 = (int)uVar8;
      if (iVar5 == 1) goto LAB_00198ba3;
LAB_00198bd9:
      if (x_00 == 0) {
        return;
      }
    }
    uVar2 = rn2(x_00);
    switch(dirs[uVar2]) {
    case 0:
      pbVar1 = (byte *)((long)iVar5 * 0xc + lVar9 * 0x24 + 0x321d25);
      *pbVar1 = *pbVar1 | 4;
      x = x - 1;
      puVar3 = &r[x][iVar5].doortable;
      bVar4 = 8;
      break;
    case 1:
      pbVar1 = (byte *)((long)iVar5 * 0xc + lVar9 * 0x24 + 0x321d25);
      *pbVar1 = *pbVar1 | 8;
      x = x + 1;
      puVar3 = &r[x][iVar5].doortable;
      bVar4 = 4;
      break;
    case 2:
      puVar3 = &r[lVar9][iVar5].doortable;
      *puVar3 = *puVar3 | 1;
      uVar6 = (ulong)(iVar5 - 1U);
      puVar3 = &r[lVar9][(int)(iVar5 - 1U)].doortable;
      bVar4 = 2;
      break;
    case 3:
      puVar3 = &r[lVar9][iVar5].doortable;
      *puVar3 = *puVar3 | 2;
      uVar6 = (ulong)(iVar5 + 1U);
      puVar3 = &r[lVar9][(int)(iVar5 + 1U)].doortable;
      bVar4 = 1;
      break;
    default:
      goto switchD_00198c11_default;
    }
    *puVar3 = *puVar3 | bVar4;
switchD_00198c11_default:
    miniwalk(x,(int)uVar6);
  } while( true );
}

Assistant:

static void miniwalk(int x, int y)
{
	int q, dir;
	int dirs[4];

	while (1) {
		q = 0;
#define doorhere (r[x][y].doortable)
		if (x>0 && (!(doorhere & LEFT)) &&
					(!r[x-1][y].doortable || !rn2(10)))
			dirs[q++] = 0;
		if (x<2 && (!(doorhere & RIGHT)) &&
					(!r[x+1][y].doortable || !rn2(10)))
			dirs[q++] = 1;
		if (y>0 && (!(doorhere & UP)) &&
					(!r[x][y-1].doortable || !rn2(10)))
			dirs[q++] = 2;
		if (y<2 && (!(doorhere & DOWN)) &&
					(!r[x][y+1].doortable || !rn2(10)))
			dirs[q++] = 3;
	/* Rogue levels aren't just 3 by 3 mazes; they have some extra
	 * connections, thus that 1/10 chance
	 */
		if (!q) return;
		dir = dirs[rn2(q)];
		switch(dir) { /* Move in direction */
			case 0: doorhere |= LEFT;
				x--;
				doorhere |= RIGHT;
				break;
			case 1: doorhere |= RIGHT;
				x++;
				doorhere |= LEFT;
				break;
			case 2: doorhere |= UP;
				y--;
				doorhere |= DOWN;
				break;
			case 3: doorhere |= DOWN;
				y++;
				doorhere |= UP;
				break;
		}
		miniwalk(x,y);
	}
}